

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::DOMCharacterDataImpl
          (DOMCharacterDataImpl *this,DOMDocument *doc,XMLCh *dat,XMLSize_t len)

{
  DOMBuffer *pDVar1;
  DOMDocumentImpl *local_50;
  XMLSize_t len_local;
  XMLCh *dat_local;
  DOMDocument *doc_local;
  DOMCharacterDataImpl *this_local;
  
  if (doc == (DOMDocument *)0x0) {
    local_50 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_50 = (DOMDocumentImpl *)&doc[-1].super_DOMNode;
  }
  this->fDoc = local_50;
  pDVar1 = DOMDocumentImpl::popBuffer(this->fDoc,len + 1);
  this->fDataBuf = pDVar1;
  if (this->fDataBuf == (DOMBuffer *)0x0) {
    pDVar1 = (DOMBuffer *)operator_new(0x20,this->fDoc);
    DOMBuffer::DOMBuffer(pDVar1,this->fDoc,len + 0xf);
    this->fDataBuf = pDVar1;
  }
  DOMBuffer::set(this->fDataBuf,dat,len);
  return;
}

Assistant:

DOMCharacterDataImpl::
DOMCharacterDataImpl(DOMDocument *doc, const XMLCh* dat, XMLSize_t len)
{
    fDoc = (DOMDocumentImpl*)doc;

    fDataBuf = fDoc->popBuffer(len+1);

    if (!fDataBuf)
        fDataBuf = new (fDoc) DOMBuffer(fDoc, len+15);

    fDataBuf->set(dat, len);
}